

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringReferenceCopy_Test::
TestBody(GeneratedMessageReflectionTest_GetStringReferenceCopy_Test *this)

{
  FieldDescriptor *field;
  pointer *__ptr;
  char *message;
  string_view src;
  string_view name;
  Metadata MVar1;
  Metadata MVar2;
  AssertionResult gtest_ar;
  string cord_scratch;
  TestCord cord_message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  undefined1 local_48 [56];
  
  proto2_unittest::TestCord::TestCord((TestCord *)local_48,(Arena *)0x0);
  local_48[0x10] = local_48[0x10] | 1;
  src._M_str = "bytes_cord";
  src._M_len = 10;
  absl::lts_20250127::Cord::operator=((Cord *)(local_48 + 0x18),src);
  MVar1 = proto2_unittest::TestCord::GetMetadata
                    ((TestCord *)&proto2_unittest::_TestCord_default_instance_);
  MVar2 = proto2_unittest::TestCord::GetMetadata
                    ((TestCord *)&proto2_unittest::_TestCord_default_instance_);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
  name._M_str = "optional_bytes_cord";
  name._M_len = 0x13;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  field = Descriptor::FindFieldByName(MVar2.descriptor,name);
  local_80.data_ =
       (AssertHelperData *)
       Reflection::GetStringReference(MVar1.reflection,(Message *)local_48,field,&local_68);
  testing::internal::CmpHelperEQ<std::__cxx11::string*,std::__cxx11::string_const*>
            (local_78,"&cord_scratch",
             "&cord_reflection->GetStringReference( cord_message, descriptor->FindFieldByName(\"optional_bytes_cord\"), &cord_scratch)"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xaa,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((string *)local_88._M_head_impl != (string *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestCord::~TestCord((TestCord *)local_48);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringReferenceCopy) {
  // Test that GetStringReference() returns the scratch string when the
  // underlying representation is not a normal string.
  unittest::TestCord cord_message;
  cord_message.set_optional_bytes_cord("bytes_cord");

  const Reflection* cord_reflection = cord_message.GetReflection();
  const Descriptor* descriptor = unittest::TestCord::descriptor();
  std::string cord_scratch;
  EXPECT_EQ(
      &cord_scratch,
      &cord_reflection->GetStringReference(
          cord_message, descriptor->FindFieldByName("optional_bytes_cord"),
          &cord_scratch));
}